

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcomp.c
# Opt level: O0

int full_pixel_exhaustive
              (FULLPEL_MV start_mv,FULLPEL_MOTION_SEARCH_PARAMS *ms_params,
              MESH_PATTERN *mesh_patterns,int *cost_list,FULLPEL_MV *best_mv,
              FULLPEL_MV_STATS *mv_stats,FULLPEL_MV *second_best_mv)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int *in_RCX;
  int *in_RDX;
  MV_COST_PARAMS *in_RSI;
  undefined4 in_EDI;
  short *in_R8;
  int costlist_has_sad;
  int baseline_interval_divisor;
  int range;
  int interval;
  int i;
  int bestsme;
  int kMinInterval;
  int kMaxRange;
  int kMinRange;
  FULLPEL_MV this_mv_2;
  int idx;
  MV_COST_PARAMS *mv_cost_params;
  FULLPEL_MV this_mv_1;
  int i_2;
  FULLPEL_MV this_mv;
  int i_1;
  int bc;
  int br;
  int ref_stride;
  buf_2d *ref;
  buf_2d *src;
  MV_COST_PARAMS *in_stack_fffffffffffffef8;
  MV_COST_PARAMS *mv;
  FULLPEL_MOTION_SEARCH_PARAMS *in_stack_ffffffffffffff00;
  FULLPEL_MOTION_SEARCH_PARAMS *buf;
  undefined8 in_stack_ffffffffffffff08;
  uint8_t *in_stack_ffffffffffffff10;
  FULLPEL_MOTION_SEARCH_PARAMS *ms_params_00;
  int local_d4;
  int local_d0;
  int local_c8;
  int local_c4;
  undefined4 in_stack_ffffffffffffff4c;
  int local_a8;
  int local_a4;
  int local_a0;
  int local_64;
  int local_5c;
  FULLPEL_MV local_4c;
  int local_48;
  int local_40;
  FULLPEL_MV *in_stack_ffffffffffffffd0;
  FULLPEL_MV *in_stack_ffffffffffffffd8;
  FULLPEL_MOTION_SEARCH_PARAMS *pFVar6;
  int in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffe4;
  FULLPEL_MOTION_SEARCH_PARAMS *in_stack_ffffffffffffffe8;
  undefined8 in_stack_fffffffffffffff0;
  MV_COST_PARAMS *pMVar7;
  short local_4;
  short sStack_2;
  
  local_d0 = in_RDX[1];
  iVar3 = *in_RDX;
  *(undefined4 *)in_R8 = in_EDI;
  if ((((iVar3 < 7) || (0x100 < iVar3)) || (local_d0 < 1)) || (iVar3 < local_d0)) {
    local_64 = 0x7fffffff;
  }
  else {
    iVar1 = iVar3 / local_d0;
    iVar2 = (int)*in_R8;
    if (iVar2 < 1) {
      iVar2 = -iVar2;
    }
    iVar4 = (int)in_R8[1];
    if (iVar4 < 1) {
      iVar4 = -iVar4;
    }
    if (iVar4 < iVar2) {
      iVar2 = (int)*in_R8;
      if (iVar2 < 1) {
        iVar2 = -iVar2;
      }
    }
    else {
      iVar2 = (int)in_R8[1];
      if (iVar2 < 1) {
        iVar2 = -iVar2;
      }
    }
    iVar4 = iVar3;
    if (iVar3 <= (iVar2 * 5) / 4) {
      iVar4 = (int)*in_R8;
      if (iVar4 < 1) {
        iVar4 = -iVar4;
      }
      iVar5 = (int)in_R8[1];
      if (iVar5 < 1) {
        iVar5 = -iVar5;
      }
      if (iVar5 < iVar4) {
        local_c4 = (int)*in_R8;
        if (local_c4 < 1) {
          local_c4 = -local_c4;
        }
      }
      else {
        local_c4 = (int)in_R8[1];
        if (local_c4 < 1) {
          local_c4 = -local_c4;
        }
      }
      iVar4 = (local_c4 * 5) / 4;
    }
    local_c8 = iVar4;
    if (0xff < iVar4) {
      local_c8 = 0x100;
    }
    if (local_d0 <= local_c8 / iVar1) {
      local_d0 = local_c8 / iVar1;
    }
    local_a8 = local_d0;
    if (in_RSI[2].error_per_bit != 0) {
      if (local_d0 < 4) {
        local_d4 = local_d0;
      }
      else {
        local_d4 = 4;
      }
      local_a8 = local_d4;
    }
    local_a0 = exhaustive_mesh_search
                         (SUB84((ulong)in_stack_fffffffffffffff0 >> 0x20,0),
                          in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe4,
                          in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
                          in_stack_ffffffffffffffd0);
    if ((1 < local_a8) && (7 < local_c8)) {
      local_a4 = 1;
      while ((local_a4 < 4 &&
             (local_a0 = exhaustive_mesh_search
                                   (SUB84((ulong)in_stack_fffffffffffffff0 >> 0x20,0),
                                    in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe4,
                                    in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
                                    in_stack_ffffffffffffffd0), in_RDX[(long)local_a4 * 2 + 1] != 1)
             )) {
        local_a4 = local_a4 + 1;
      }
    }
    if (local_a0 < 0x7fffffff) {
      local_a0 = get_mvpred_var_cost((FULLPEL_MOTION_SEARCH_PARAMS *)CONCAT44(local_c8,iVar1),
                                     (FULLPEL_MV *)CONCAT44(in_stack_ffffffffffffff4c,iVar3),
                                     (FULLPEL_MV_STATS *)CONCAT44(iVar2,iVar4));
    }
    if (in_RCX != (int *)0x0) {
      ms_params_00 = (FULLPEL_MOTION_SEARCH_PARAMS *)in_RSI->mvcost[0];
      local_4 = (short)*(undefined4 *)in_R8;
      sStack_2 = (short)((uint)*(undefined4 *)in_R8 >> 0x10);
      buf = ms_params_00;
      mv = in_RSI;
      get_buf_from_fullmv((buf_2d *)in_stack_ffffffffffffff00,
                          (FULLPEL_MV *)in_stack_fffffffffffffef8);
      iVar3 = get_mvpred_sad(ms_params_00,(buf_2d *)in_RSI,in_stack_ffffffffffffff10,
                             (int)((ulong)in_stack_ffffffffffffff08 >> 0x20));
      *in_RCX = iVar3;
      iVar3 = check_bounds((FullMvLimits *)&mv[1].error_per_bit,(int)local_4,(int)sStack_2,1);
      if (iVar3 == 0) {
        for (local_48 = 0; local_48 < 4; local_48 = local_48 + 1) {
          local_4c.col = sStack_2 + *(short *)(calc_int_sad_list_neighbors + (long)local_48 * 4 + 2)
          ;
          local_4c.row = local_4 + *(short *)(calc_int_sad_list_neighbors + (long)local_48 * 4);
          iVar3 = av1_is_fullmv_in_range((FullMvLimits *)&mv[1].error_per_bit,local_4c);
          pFVar6 = buf;
          pMVar7 = mv;
          if (iVar3 == 0) {
            in_RCX[local_48 + 1] = 0x7fffffff;
          }
          else {
            get_buf_from_fullmv((buf_2d *)buf,(FULLPEL_MV *)mv);
            iVar3 = get_mvpred_sad(ms_params_00,(buf_2d *)in_RSI,in_stack_ffffffffffffff10,
                                   (int)((ulong)in_stack_ffffffffffffff08 >> 0x20));
            in_RCX[local_48 + 1] = iVar3;
            in_stack_fffffffffffffef8 = mv;
            in_stack_ffffffffffffff00 = buf;
          }
          buf = pFVar6;
          mv = pMVar7;
        }
      }
      else {
        for (local_40 = 0; iVar3 = (int)((ulong)mv >> 0x20), local_40 < 4; local_40 = local_40 + 1)
        {
          pFVar6 = buf;
          get_buf_from_fullmv((buf_2d *)in_stack_ffffffffffffff00,
                              (FULLPEL_MV *)in_stack_fffffffffffffef8);
          iVar3 = get_mvpred_sad(ms_params_00,(buf_2d *)in_RSI,&buf->bsize,iVar3);
          in_RCX[local_40 + 1] = iVar3;
          buf = pFVar6;
        }
      }
      iVar3 = mvsad_err_cost_((FULLPEL_MV *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
      *in_RCX = iVar3 + *in_RCX;
      for (local_5c = 0; local_5c < 4; local_5c = local_5c + 1) {
        if (in_RCX[local_5c + 1] != 0x7fffffff) {
          iVar3 = mvsad_err_cost_((FULLPEL_MV *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8)
          ;
          in_RCX[local_5c + 1] = iVar3 + in_RCX[local_5c + 1];
        }
      }
    }
    local_64 = local_a0;
  }
  return local_64;
}

Assistant:

static int full_pixel_exhaustive(const FULLPEL_MV start_mv,
                                 const FULLPEL_MOTION_SEARCH_PARAMS *ms_params,
                                 const struct MESH_PATTERN *const mesh_patterns,
                                 int *cost_list, FULLPEL_MV *best_mv,
                                 FULLPEL_MV_STATS *mv_stats,
                                 FULLPEL_MV *second_best_mv) {
  const int kMinRange = 7;
  const int kMaxRange = 256;
  const int kMinInterval = 1;

  int bestsme;
  int i;
  int interval = mesh_patterns[0].interval;
  int range = mesh_patterns[0].range;
  int baseline_interval_divisor;

  // TODO(chiyotsai@google.com): Currently exhaustive search calls single ref
  // version of sad and variance function. We still need to check the
  // performance when compound ref exhaustive search is enabled.
  assert(!ms_params->ms_buffers.second_pred &&
         "Mesh search does not support compound mode!");

  *best_mv = start_mv;

  // Trap illegal values for interval and range for this function.
  if ((range < kMinRange) || (range > kMaxRange) || (interval < kMinInterval) ||
      (interval > range))
    return INT_MAX;

  baseline_interval_divisor = range / interval;

  // Check size of proposed first range against magnitude of the centre
  // value used as a starting point.
  range = AOMMAX(range, (5 * AOMMAX(abs(best_mv->row), abs(best_mv->col))) / 4);
  range = AOMMIN(range, kMaxRange);
  interval = AOMMAX(interval, range / baseline_interval_divisor);
  // Use a small search step/interval for certain kind of clips.
  // For example, screen content clips with a lot of texts.
  // Large interval could lead to a false matching position, and it can't find
  // the best global candidate in following iterations due to reduced search
  // range. The solution here is to use a small search iterval in the beginning
  // and thus reduces the chance of missing the best candidate.
  if (ms_params->fine_search_interval) {
    interval = AOMMIN(interval, 4);
  }

  // initial search
  bestsme = exhaustive_mesh_search(*best_mv, ms_params, range, interval,
                                   best_mv, second_best_mv);

  if ((interval > kMinInterval) && (range > kMinRange)) {
    // Progressive searches with range and step size decreasing each time
    // till we reach a step size of 1. Then break out.
    for (i = 1; i < MAX_MESH_STEP; ++i) {
      // First pass with coarser step and longer range
      bestsme = exhaustive_mesh_search(
          *best_mv, ms_params, mesh_patterns[i].range,
          mesh_patterns[i].interval, best_mv, second_best_mv);

      if (mesh_patterns[i].interval == 1) break;
    }
  }

  if (bestsme < INT_MAX) {
    bestsme = get_mvpred_var_cost(ms_params, best_mv, mv_stats);
  }

  // Return cost list.
  if (cost_list) {
    if (USE_SAD_COSTLIST) {
      const int costlist_has_sad = 0;
      calc_int_sad_list(*best_mv, ms_params, cost_list, costlist_has_sad);
    } else {
      calc_int_cost_list(*best_mv, ms_params, cost_list);
    }
  }
  return bestsme;
}